

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereCheckIfBloomFilterIsUseful(WhereInfo *pWInfo)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  Table *pTVar4;
  long lVar5;
  short sVar6;
  
  bVar1 = pWInfo->nLevel;
  lVar5 = 0;
  sVar6 = 0;
  while( true ) {
    if ((ulong)bVar1 * 0x70 - lVar5 == 0) {
      return;
    }
    lVar3 = *(long *)((long)&pWInfo->a[0].pWLoop + lVar5);
    pTVar4 = pWInfo->pTabList->a[*(byte *)(lVar3 + 0x10)].pSTab;
    if ((pTVar4->tabFlags & 0x10) == 0) break;
    pTVar4->tabFlags = pTVar4->tabFlags | 0x100;
    if (((lVar5 != 0) &&
        (uVar2 = *(uint *)(lVar3 + 0x30), (uVar2 & 0x300) != 0 && (~uVar2 & 0x800001) == 0)) &&
       (pTVar4->nRowLogEst < sVar6)) {
      *(uint *)(lVar3 + 0x30) = uVar2 & 0xffbfffbf | 0x400000;
    }
    sVar6 = sVar6 + *(short *)(lVar3 + 0x16);
    lVar5 = lVar5 + 0x70;
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void whereCheckIfBloomFilterIsUseful(
  const WhereInfo *pWInfo
){
  int i;
  LogEst nSearch = 0;

  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_BloomFilter) );
  for(i=0; i<pWInfo->nLevel; i++){
    WhereLoop *pLoop = pWInfo->a[i].pWLoop;
    const unsigned int reqFlags = (WHERE_SELFCULL|WHERE_COLUMN_EQ);
    SrcItem *pItem = &pWInfo->pTabList->a[pLoop->iTab];
    Table *pTab = pItem->pSTab;
    if( (pTab->tabFlags & TF_HasStat1)==0 ) break;
    pTab->tabFlags |= TF_MaybeReanalyze;
    if( i>=1
     && (pLoop->wsFlags & reqFlags)==reqFlags
     /* vvvvvv--- Always the case if WHERE_COLUMN_EQ is defined */
     && ALWAYS((pLoop->wsFlags & (WHERE_IPK|WHERE_INDEXED))!=0)
    ){
      if( nSearch > pTab->nRowLogEst ){
        testcase( pItem->fg.jointype & JT_LEFT );
        pLoop->wsFlags |= WHERE_BLOOMFILTER;
        pLoop->wsFlags &= ~WHERE_IDX_ONLY;
        WHERETRACE(0xffffffff, (
           "-> use Bloom-filter on loop %c because there are ~%.1e "
           "lookups into %s which has only ~%.1e rows\n",
           pLoop->cId, (double)sqlite3LogEstToInt(nSearch), pTab->zName,
           (double)sqlite3LogEstToInt(pTab->nRowLogEst)));
      }
    }
    nSearch += pLoop->nOut;
  }
}